

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::setNewGeometry(QMdiSubWindowPrivate *this,QPoint *pos)

{
  Operation *key;
  undefined4 uVar1;
  undefined4 uVar2;
  QWidget *this_00;
  long lVar3;
  QWidgetData *pQVar4;
  int iVar5;
  iterator iVar6;
  QSize QVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  key = &this->currentOperation;
  iVar6 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                    (&this->operationMap,key);
  uVar9 = *(uint *)((long)iVar6.i._M_node + 0x28);
  uVar13 = (pos->xp).m_i;
  iVar12 = (pos->yp).m_i;
  uVar10 = *(uint *)(*(long *)&this_00->field_0x8 + 0x388);
  uVar8 = ~uVar10;
  if ((uVar8 & 3) != 0) {
    lVar3 = *(long *)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 0x20);
    iVar5 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
    iVar11 = iVar12;
    if (((uVar10 & 2) == 0) && (((uVar9 & 0x20) != 0 || (*key == Move)))) {
      iVar11 = (this->mousePressPosition).yp.m_i - (this->oldGeometry).y1.m_i;
      if (iVar11 <= iVar12) {
        iVar11 = iVar12;
      }
      if (iVar5 + -4 <= iVar11) {
        iVar11 = iVar5 + -4;
      }
    }
    uVar8 = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
    iVar12 = iVar11;
    if (*key == Move) {
      if ((uVar10 & 1) == 0) {
        uVar8 = uVar8 - 4;
        uVar15 = 5;
        if (5 < (int)uVar13) {
          uVar15 = uVar13;
        }
        uVar13 = uVar15;
        if ((int)uVar8 <= (int)uVar15) {
          uVar13 = uVar8;
        }
      }
      if (((uVar10 & 2) == 0) && (iVar12 = iVar5 + -4, iVar11 < iVar5 + -4)) {
        iVar12 = iVar11;
      }
    }
    else {
      if ((uVar10 & 1) == 0) {
        if ((uVar9 & 0x10) == 0) {
          uVar8 = (uVar8 - (this->oldGeometry).x2.m_i) + (this->mousePressPosition).xp.m_i;
          if ((int)uVar8 < (int)uVar13) {
            uVar13 = uVar8;
          }
        }
        else {
          uVar8 = (this->mousePressPosition).xp.m_i - (this->oldGeometry).x1.m_i;
          if ((int)uVar13 < (int)uVar8) {
            uVar13 = uVar8;
          }
        }
      }
      uVar8 = uVar9 & 0x20 | uVar10 & 2;
      if ((uVar8 == 0) &&
         (iVar12 = (iVar5 - (this->oldGeometry).y2.m_i) + (this->mousePressPosition).yp.m_i,
         iVar11 <= iVar12)) {
        iVar12 = iVar11;
      }
    }
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  if ((uVar9 & 3) == 0) {
    local_48.x1.m_i = (this_00->data->crect).x1.m_i;
    local_48.y1.m_i = (this_00->data->crect).y1.m_i;
  }
  else {
    iVar14 = uVar13 - (this->mousePressPosition).xp.m_i;
    iVar16 = ((this->oldGeometry).x2.m_i - (this->oldGeometry).x1.m_i) + 1;
    iVar5 = iVar16 - (this->internalMinimumSize).wd.m_i;
    QVar7 = QWidget::maximumSize(this_00);
    iVar11 = 0;
    if ((uVar9 & 1) != 0) {
      iVar11 = iVar14;
      if (iVar14 < 1) {
        if (((uVar9 & 4) != 0) && (iVar11 = iVar16 - QVar7.wd.m_i, iVar11 < iVar14)) {
          iVar11 = iVar14;
        }
      }
      else if (((uVar9 & 4) != 0) && (iVar11 = iVar5, iVar14 < iVar5)) {
        iVar11 = iVar14;
      }
    }
    uVar15 = iVar12 - (this->mousePressPosition).yp.m_i;
    iVar5 = ((this->oldGeometry).y2.m_i - (this->oldGeometry).y1.m_i) + 1;
    uVar10 = iVar5 - (this->internalMinimumSize).ht.m_i;
    QVar7 = QWidget::maximumSize(this_00);
    uVar8 = 0;
    if ((uVar9 & 2) != 0) {
      uVar8 = uVar15;
      if ((int)uVar15 < 1) {
        if (((uVar9 & 8) != 0) && (uVar8 = iVar5 - QVar7.ht.m_i, (int)uVar8 < (int)uVar15)) {
          uVar8 = uVar15;
        }
      }
      else if (((uVar9 & 8) != 0) && (uVar8 = uVar10, (int)uVar15 < (int)uVar10)) {
        uVar8 = uVar15;
      }
    }
    uVar1 = (this->oldGeometry).x1;
    uVar2 = (this->oldGeometry).y1;
    local_48.x1.m_i = iVar11 + uVar1;
    local_48.y1.m_i = uVar8 + uVar2;
  }
  if ((uVar9 & 0xc) == 0) {
    pQVar4 = this_00->data;
    iVar11 = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
    iVar12 = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
  }
  else {
    iVar5 = uVar13 - (this->mousePressPosition).xp.m_i;
    iVar12 = iVar12 - (this->mousePressPosition).yp.m_i;
    auVar17._0_4_ = -(uint)((uVar9 & 0x20) == 0);
    auVar17._4_4_ = -(uint)((uVar9 & 8) == 0);
    auVar17._8_4_ = -(uint)((uVar9 & 0x10) == 0);
    auVar17._12_4_ = -(uint)((uVar9 & 4) == 0);
    uVar9 = movmskps(uVar8,auVar17);
    iVar11 = -iVar5;
    if ((uVar9 & 4) != 0) {
      iVar11 = iVar5;
    }
    if ((uVar9 & 8) != 0) {
      iVar11 = 0;
    }
    iVar5 = -iVar12;
    if ((uVar9 & 1) != 0) {
      iVar5 = iVar12;
    }
    if ((uVar9 & 2) != 0) {
      iVar5 = 0;
    }
    iVar11 = ((this->oldGeometry).x2.m_i - (this->oldGeometry).x1.m_i) + iVar11;
    iVar12 = (iVar5 + (this->oldGeometry).y2.m_i) - (this->oldGeometry).y1.m_i;
  }
  uVar9 = (this->internalMinimumSize).wd.m_i;
  uVar13 = (this->internalMinimumSize).ht.m_i;
  uVar10 = -(uint)((int)uVar9 < (int)(iVar11 + 1U));
  uVar8 = -(uint)((int)uVar13 < (int)(iVar12 + 1U));
  local_48.x2.m_i = local_48.x1.m_i + -1 + (~uVar10 & uVar9 | iVar11 + 1U & uVar10);
  local_48.y2.m_i = local_48.y1.m_i + -1 + (~uVar8 & uVar13 | iVar12 + 1U & uVar8);
  if (this->isInRubberBandMode == true) {
    QRubberBand::setGeometry(this->rubberBand,&local_48);
  }
  else {
    QWidget::setGeometry(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setNewGeometry(const QPoint &pos)
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(currentOperation != None);
    Q_ASSERT(parent);

    uint cflags = operationMap.find(currentOperation).value().changeFlags;
    int posX = pos.x();
    int posY = pos.y();

    const bool restrictHorizontal = !q->testOption(QMdiSubWindow::AllowOutsideAreaHorizontally);
    const bool restrictVertical = !q->testOption(QMdiSubWindow::AllowOutsideAreaVertically);

    if (restrictHorizontal || restrictVertical) {
        QRect parentRect = q->parentWidget()->rect();
        if (restrictVertical && (cflags & VResizeReverse || currentOperation == Move)) {
            posY = qMin(qMax(mousePressPosition.y() - oldGeometry.y(), posY),
                        parentRect.height() - BoundaryMargin);
        }
        if (currentOperation == Move) {
            if (restrictHorizontal)
                posX = qMin(qMax(BoundaryMargin, posX), parentRect.width() - BoundaryMargin);
            if (restrictVertical)
                posY = qMin(posY, parentRect.height() - BoundaryMargin);
        } else {
            if (restrictHorizontal) {
                if (cflags & HResizeReverse)
                    posX = qMax(mousePressPosition.x() - oldGeometry.x(), posX);
                else
                    posX = qMin(parentRect.width() - (oldGeometry.x() + oldGeometry.width()
                                                      - mousePressPosition.x()), posX);
            }
            if (restrictVertical && !(cflags & VResizeReverse)) {
                posY = qMin(parentRect.height() - (oldGeometry.y() + oldGeometry.height()
                                                   - mousePressPosition.y()), posY);
            }
        }
    }

    QRect geometry;
    if (cflags & (HMove | VMove)) {
        int dx = getMoveDeltaComponent(cflags, HMove, HResize, posX - mousePressPosition.x(),
                                       oldGeometry.width() - internalMinimumSize.width(),
                                       oldGeometry.width() - q->maximumWidth());
        int dy = getMoveDeltaComponent(cflags, VMove, VResize, posY - mousePressPosition.y(),
                                       oldGeometry.height() - internalMinimumSize.height(),
                                       oldGeometry.height() - q->maximumHeight());
        geometry.setTopLeft(oldGeometry.topLeft() + QPoint(dx, dy));
    } else {
        geometry.setTopLeft(q->geometry().topLeft());
    }

    if (cflags & (HResize | VResize)) {
        int dx = getResizeDeltaComponent(cflags, HResize, HResizeReverse,
                                         posX - mousePressPosition.x());
        int dy = getResizeDeltaComponent(cflags, VResize, VResizeReverse,
                                         posY - mousePressPosition.y());
        geometry.setSize(oldGeometry.size() + QSize(dx, dy));
    } else {
        geometry.setSize(q->geometry().size());
    }

    setNewGeometry(&geometry);
}